

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture_exception.h
# Opt level: O0

void __thiscall L15_3::BadMeanArgumentException::msg(BadMeanArgumentException *this)

{
  ostream *poVar1;
  BadMeanArgumentException *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Mean argument(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_a);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_b);
  std::operator<<(poVar1,") invalid.\n");
  return;
}

Assistant:

inline void BadMeanArgumentException::msg() const {
        std::cout << "Mean argument(" << _a << ", " << _b << ") invalid.\n";
    }